

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_record(ptls_t *tls,st_ptls_record_t *rec,uint8_t *src,size_t *len)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  size_t local_60;
  size_t addlen;
  undefined8 local_50;
  undefined8 local_48;
  size_t *local_40;
  uint8_t *end;
  size_t *psStack_30;
  int ret;
  size_t *len_local;
  uint8_t *src_local;
  st_ptls_record_t *rec_local;
  ptls_t *tls_local;
  
  psStack_30 = len;
  len_local = (size_t *)src;
  src_local = &rec->type;
  rec_local = (st_ptls_record_t *)tls;
  if (((tls->recvbuf).rec.base == (uint8_t *)0x0) && (4 < *len)) {
    iVar4 = parse_record_header(rec,src);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (*(long *)(src_local + 8) + 5U <= *psStack_30) {
      *(long *)(src_local + 0x10) = (long)len_local + 5;
      *psStack_30 = *(long *)(src_local + 8) + 5;
      return 0;
    }
    end._4_4_ = 0;
  }
  puVar1 = src_local;
  local_40 = (size_t *)((long)len_local + *psStack_30);
  memset(&addlen,0,0x18);
  *(size_t *)puVar1 = addlen;
  *(undefined8 *)(puVar1 + 8) = local_50;
  *(undefined8 *)(puVar1 + 0x10) = local_48;
  if (rec_local->fragment == (uint8_t *)0x0) {
    ptls_buffer_init((ptls_buffer_t *)&rec_local->fragment,"",0);
    iVar4 = ptls_buffer_reserve((ptls_buffer_t *)&rec_local->fragment,5);
    if (iVar4 != 0) {
      return iVar4;
    }
    end._4_4_ = 0;
  }
  while (rec_local[1].length < 5) {
    if (len_local == local_40) {
      return 0x202;
    }
    sVar3 = *len_local;
    puVar1 = rec_local->fragment;
    sVar2 = rec_local[1].length;
    rec_local[1].length = sVar2 + 1;
    puVar1[sVar2] = (uint8_t)sVar3;
    len_local = (size_t *)((long)len_local + 1);
  }
  end._4_4_ = parse_record_header((st_ptls_record_t *)src_local,rec_local->fragment);
  tls_local._4_4_ = end._4_4_;
  if (end._4_4_ == 0) {
    local_60 = (*(long *)(src_local + 8) + 5) - rec_local[1].length;
    if (local_60 != 0) {
      end._4_4_ = ptls_buffer_reserve((ptls_buffer_t *)&rec_local->fragment,local_60);
      if (end._4_4_ != 0) {
        return end._4_4_;
      }
      if ((ulong)((long)local_40 - (long)len_local) < local_60) {
        local_60 = (long)local_40 - (long)len_local;
      }
      if (local_60 != 0) {
        memcpy(rec_local->fragment + rec_local[1].length,len_local,local_60);
        rec_local[1].length = local_60 + rec_local[1].length;
        len_local = (size_t *)(local_60 + (long)len_local);
      }
    }
    if (rec_local[1].length == *(long *)(src_local + 8) + 5U) {
      *(uint8_t **)(src_local + 0x10) = rec_local->fragment + 5;
      end._4_4_ = 0;
    }
    else {
      end._4_4_ = 0x202;
    }
    *psStack_30 = *psStack_30 - ((long)local_40 - (long)len_local);
    tls_local._4_4_ = end._4_4_;
  }
  return tls_local._4_4_;
}

Assistant:

static int parse_record(ptls_t *tls, struct st_ptls_record_t *rec, const uint8_t *src, size_t *len)
{
    int ret;

    if (tls->recvbuf.rec.base == NULL && *len >= 5) {
        /* fast path */
        if ((ret = parse_record_header(rec, src)) != 0)
            return ret;
        if (5 + rec->length <= *len) {
            rec->fragment = src + 5;
            *len = rec->length + 5;
            return 0;
        }
    }

    /* slow path */
    const uint8_t *const end = src + *len;
    *rec = (struct st_ptls_record_t){0};

    if (tls->recvbuf.rec.base == NULL) {
        ptls_buffer_init(&tls->recvbuf.rec, "", 0);
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, 5)) != 0)
            return ret;
    }

    /* fill and parse the header */
    while (tls->recvbuf.rec.off < 5) {
        if (src == end)
            return PTLS_ERROR_IN_PROGRESS;
        tls->recvbuf.rec.base[tls->recvbuf.rec.off++] = *src++;
    }
    if ((ret = parse_record_header(rec, tls->recvbuf.rec.base)) != 0)
        return ret;

    /* fill the fragment */
    size_t addlen = rec->length + 5 - tls->recvbuf.rec.off;
    if (addlen != 0) {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, addlen)) != 0)
            return ret;
        if (addlen > (size_t)(end - src))
            addlen = end - src;
        if (addlen != 0) {
            memcpy(tls->recvbuf.rec.base + tls->recvbuf.rec.off, src, addlen);
            tls->recvbuf.rec.off += addlen;
            src += addlen;
        }
    }

    /* set rec->fragment if a complete record has been parsed */
    if (tls->recvbuf.rec.off == rec->length + 5) {
        rec->fragment = tls->recvbuf.rec.base + 5;
        ret = 0;
    } else {
        ret = PTLS_ERROR_IN_PROGRESS;
    }

    *len -= end - src;
    return ret;
}